

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleMake(TranslateToFuzzReader *this,Type type)

{
  Type *pTVar1;
  uintptr_t *puVar2;
  TupleMake *pTVar3;
  Expression *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elements;
  Type local_48;
  Type type_local;
  Iterator __begin1;
  
  local_48.id = type.id;
  if (((this->wasm->features).features & 0x200) == 0) {
    __assert_fail("wasm.features.hasMultivalue()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xaf3,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
  }
  if ((6 < type.id) && ((type.id & 1) != 0)) {
    auStack_68 = (undefined1  [8])0x0;
    elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    type_local.id = (uintptr_t)&local_48;
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    pTVar1 = (Type *)Type::size((Type *)type_local.id);
    if (pTVar1 != (Type *)0x0) {
      do {
        do {
          puVar2 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)&type_local);
          local_70 = make(this,(Type)*puVar2);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                     &local_70);
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
        } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                 != pTVar1);
      } while ((Type *)type_local.id != &local_48);
    }
    pTVar3 = Builder::
             makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       (&this->builder,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_68);
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)elements.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
    }
    return (Expression *)pTVar3;
  }
  __assert_fail("type.isTuple()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0xaf4,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleMake(Type type) {
  assert(wasm.features.hasMultivalue());
  assert(type.isTuple());
  std::vector<Expression*> elements;
  for (const auto& t : type) {
    elements.push_back(make(t));
  }
  return builder.makeTupleMake(std::move(elements));
}